

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O3

void __thiscall arith_uint256_tests::shifts::test_method(shifts *this)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint T;
  base_uint<256U> *pbVar6;
  long lVar7;
  undefined8 in_RCX;
  uint uVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  check_type cVar40;
  ulong uVar11;
  uint i;
  uint shift;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  arith_uint256 c2L;
  arith_uint256 TmpL;
  uchar TmpArray [32];
  check_type cVar41;
  check_type cVar42;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  allocator_type local_131;
  assertion_result local_130;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  assertion_result local_f8;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  assertion_result local_d8;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  arith_uint256 local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  byte local_78 [32];
  undefined1 local_58 [8];
  undefined1 auStack_50 [16];
  assertion_result *paStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  _cVar40 = CHECK_PRED;
  while( true ) {
    cVar40 = (check_type)_cVar40;
    shiftArrayLeft(local_78,OneArray,cVar40,(uint)in_RCX);
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xa7;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_78,local_58,
               &local_131);
    if ((long)local_130.m_message.px - local_130._0_8_ != 0x20) break;
    local_58 = *(undefined1 (*) [8])local_130._0_8_;
    auStack_50 = *(undefined1 (*) [16])(local_130._0_8_ + 8);
    paStack_40 = *(assertion_result **)(local_130._0_8_ + 0x18);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013c4798;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013c4790;
    auStack_50._0_8_ = uRam00000000013c4788;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    auVar12 = *(undefined1 (*) [16])(pbVar6->pn + 4);
    local_d8.m_message.pn.pi_._0_1_ = auVar12[0];
    local_d8.m_message.pn.pi_._1_1_ = auVar12[1];
    local_d8.m_message.pn.pi_._2_1_ = auVar12[2];
    local_d8.m_message.pn.pi_._3_1_ = auVar12[3];
    local_d8.m_message.pn.pi_._4_1_ = auVar12[4];
    local_d8.m_message.pn.pi_._5_1_ = auVar12[5];
    local_d8.m_message.pn.pi_._6_1_ = auVar12[6];
    local_d8.m_message.pn.pi_._7_1_ = auVar12[7];
    cStack_c0 = auVar12[8];
    cStack_bf = auVar12[9];
    cStack_be = auVar12[10];
    cStack_bd = auVar12[0xb];
    cStack_bc = auVar12[0xc];
    cStack_bb = auVar12[0xd];
    cStack_ba = auVar12[0xe];
    cStack_b9 = auVar12[0xf];
    auVar12[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar12[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar12[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar12[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar12[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar12[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar12[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar12[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar12[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar12[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar12[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar12[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar12[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar12[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar12[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar12[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar35[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_d8.m_message.pn.pi_);
    auVar35[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_d8.m_message.pn.pi_._1_1_);
    auVar35[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_d8.m_message.pn.pi_._2_1_);
    auVar35[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_d8.m_message.pn.pi_._3_1_);
    auVar35[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_d8.m_message.pn.pi_._4_1_);
    auVar35[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_d8.m_message.pn.pi_._5_1_);
    auVar35[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_d8.m_message.pn.pi_._6_1_);
    auVar35[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_d8.m_message.pn.pi_._7_1_);
    auVar35[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_c0);
    auVar35[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_bf);
    auVar35[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_be);
    auVar35[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_bd);
    auVar35[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_bc);
    auVar35[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_bb);
    auVar35[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_ba);
    auVar35[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_b9);
    auVar12 = auVar12 & auVar35;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i)";
    local_140 = "";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_148;
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_150 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_158,0xa7);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    if ((char *)local_130._0_8_ != (char *)0x0) {
      operator_delete((void *)local_130._0_8_,(long)local_130.m_message.pn.pi_ - local_130._0_8_);
    }
    local_98._8_8_ = uRam00000000013c4788;
    local_98._0_8_ = OneL;
    local_88._8_8_ = uRam00000000013c4798;
    local_88._0_8_ = _DAT_013c4790;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,cVar40);
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_160 = "";
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xa9;
    file_00.m_begin = (iterator)&local_168;
    msg_00.m_end = pvVar10;
    msg_00.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
               msg_00);
    paStack_40 = (assertion_result *)uRam00000000013c4798;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013c4790;
    auStack_50._0_8_ = uRam00000000013c4788;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar26[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar26[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar26[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar26[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar26[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar26[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar26[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar26[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar26[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar26[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar26[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar26[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar26[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar26[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar26[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar26[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar13[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar13[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar13[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar13[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar13[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar13[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar13[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar13[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar13[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar13[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar13[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar13[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar13[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar13[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar13[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar13[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar13 = auVar13 & auVar26;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = 0;
    local_d8.m_message.px._1_1_ = 0;
    local_d8.m_message.px._2_1_ = 0;
    local_d8.m_message.px._3_1_ = 0;
    local_d8.m_message.px._4_1_ = 0;
    local_d8.m_message.px._5_1_ = 0;
    local_d8.m_message.px._6_1_ = 0;
    local_d8.m_message.px._7_1_ = 0;
    local_d8.m_message.pn.pi_._0_1_ = 0;
    local_d8.m_message.pn.pi_._1_1_ = 0;
    local_d8.m_message.pn.pi_._2_1_ = 0;
    local_d8.m_message.pn.pi_._3_1_ = 0;
    local_d8.m_message.pn.pi_._4_1_ = 0;
    local_d8.m_message.pn.pi_._5_1_ = 0;
    local_d8.m_message.pn.pi_._6_1_ = 0;
    local_d8.m_message.pn.pi_._7_1_ = 0;
    local_f8._0_8_ = "TmpL == (OneL << i)";
    local_f8.m_message.px = (element_type *)0xe60626;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_f8;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_180 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_188,0xa9);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xaa;
    file_01.m_begin = (iterator)&local_198;
    msg_01.m_end = pvVar10;
    msg_01.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
               msg_01);
    paStack_40 = (assertion_result *)uRam00000000013c47d8;
    local_58 = (undefined1  [8])HalfL;
    auStack_50._8_8_ = _DAT_013c47d0;
    auStack_50._0_8_ = uRam00000000013c47c8;
    pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,0xff - cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    paStack_40 = (assertion_result *)uRam00000000013c4798;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013c4790;
    auStack_50._0_8_ = uRam00000000013c4788;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    local_d8.m_message.pn.pi_._0_1_ = (char)pbVar6->pn[4];
    local_d8.m_message.pn.pi_._1_1_ = *(char *)((long)pbVar6->pn + 0x11);
    local_d8.m_message.pn.pi_._2_1_ = *(char *)((long)pbVar6->pn + 0x12);
    local_d8.m_message.pn.pi_._3_1_ = *(char *)((long)pbVar6->pn + 0x13);
    local_d8.m_message.pn.pi_._4_1_ = (char)pbVar6->pn[5];
    local_d8.m_message.pn.pi_._5_1_ = *(char *)((long)pbVar6->pn + 0x15);
    local_d8.m_message.pn.pi_._6_1_ = *(char *)((long)pbVar6->pn + 0x16);
    local_d8.m_message.pn.pi_._7_1_ = *(char *)((long)pbVar6->pn + 0x17);
    cStack_c0 = (char)pbVar6->pn[6];
    cStack_bf = *(char *)((long)pbVar6->pn + 0x19);
    cStack_be = *(char *)((long)pbVar6->pn + 0x1a);
    cStack_bd = *(char *)((long)pbVar6->pn + 0x1b);
    cStack_bc = (char)pbVar6->pn[7];
    cStack_bb = *(char *)((long)pbVar6->pn + 0x1d);
    cStack_ba = *(char *)((long)pbVar6->pn + 0x1e);
    cStack_b9 = *(char *)((long)pbVar6->pn + 0x1f);
    auVar27[0] = -((char)local_d8.m_message.pn.pi_ == (char)local_b8.super_base_uint<256U>.pn[4]);
    auVar27[1] = -(local_d8.m_message.pn.pi_._1_1_ == local_b8.super_base_uint<256U>.pn[4]._1_1_);
    auVar27[2] = -(local_d8.m_message.pn.pi_._2_1_ == local_b8.super_base_uint<256U>.pn[4]._2_1_);
    auVar27[3] = -(local_d8.m_message.pn.pi_._3_1_ == local_b8.super_base_uint<256U>.pn[4]._3_1_);
    auVar27[4] = -(local_d8.m_message.pn.pi_._4_1_ == (char)local_b8.super_base_uint<256U>.pn[5]);
    auVar27[5] = -(local_d8.m_message.pn.pi_._5_1_ == local_b8.super_base_uint<256U>.pn[5]._1_1_);
    auVar27[6] = -(local_d8.m_message.pn.pi_._6_1_ == local_b8.super_base_uint<256U>.pn[5]._2_1_);
    auVar27[7] = -(local_d8.m_message.pn.pi_._7_1_ == local_b8.super_base_uint<256U>.pn[5]._3_1_);
    auVar27[8] = -(cStack_c0 == (char)local_b8.super_base_uint<256U>.pn[6]);
    auVar27[9] = -(cStack_bf == local_b8.super_base_uint<256U>.pn[6]._1_1_);
    auVar27[10] = -(cStack_be == local_b8.super_base_uint<256U>.pn[6]._2_1_);
    auVar27[0xb] = -(cStack_bd == local_b8.super_base_uint<256U>.pn[6]._3_1_);
    auVar27[0xc] = -(cStack_bc == (char)local_b8.super_base_uint<256U>.pn[7]);
    auVar27[0xd] = -(cStack_bb == local_b8.super_base_uint<256U>.pn[7]._1_1_);
    auVar27[0xe] = -(cStack_ba == local_b8.super_base_uint<256U>.pn[7]._2_1_);
    auVar27[0xf] = -(cStack_b9 == local_b8.super_base_uint<256U>.pn[7]._3_1_);
    auVar14[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar14[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar14[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar14[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar14[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar14[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar14[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar14[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar14[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar14[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar14[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar14[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar14[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar14[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar14[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar14[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar14 = auVar14 & auVar27;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_130._0_8_ = "(HalfL >> (255-i)) == (OneL << i)";
    local_130.m_message.px = (element_type *)0xe60648;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_130;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1b0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_1b8,0xaa);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    local_98._8_8_ = uRam00000000013c47c8;
    local_98._0_8_ = HalfL;
    local_88._8_8_ = uRam00000000013c47d8;
    local_88._0_8_ = _DAT_013c47d0;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,0xff - cVar40);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xac;
    file_02.m_begin = (iterator)&local_1c8;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
               msg_02);
    paStack_40 = (assertion_result *)uRam00000000013c4798;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013c4790;
    auStack_50._0_8_ = uRam00000000013c4788;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar28[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar28[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar28[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar28[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar28[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar28[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar28[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar28[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar28[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar28[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar28[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar28[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar28[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar28[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar28[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar28[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar15[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar15[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar15[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar15[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar15[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar15[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar15[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar15[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar15[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar15[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar15[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar15[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar15[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar15[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar15[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar15[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar15 = auVar15 & auVar28;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = '\0';
    local_d8.m_message.px._1_1_ = '\0';
    local_d8.m_message.px._2_1_ = '\0';
    local_d8.m_message.px._3_1_ = '\0';
    local_d8.m_message.px._4_1_ = '\0';
    local_d8.m_message.px._5_1_ = '\0';
    local_d8.m_message.px._6_1_ = '\0';
    local_d8.m_message.px._7_1_ = '\0';
    local_d8.m_message.pn.pi_._0_1_ = '\0';
    local_d8.m_message.pn.pi_._1_1_ = '\0';
    local_d8.m_message.pn.pi_._2_1_ = '\0';
    local_d8.m_message.pn.pi_._3_1_ = '\0';
    local_d8.m_message.pn.pi_._4_1_ = '\0';
    local_d8.m_message.pn.pi_._5_1_ = '\0';
    local_d8.m_message.pn.pi_._6_1_ = '\0';
    local_d8.m_message.pn.pi_._7_1_ = '\0';
    local_f8._0_8_ = "TmpL == (OneL << i)";
    local_f8.m_message.px = (element_type *)0xe60626;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_f8;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1e0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    uVar8 = 0xac;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_1e8,0xac);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    shiftArrayLeft(local_78,R1Array,cVar40,uVar8);
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0xaf;
    file_03.m_begin = (iterator)&local_1f8;
    msg_03.m_end = pvVar10;
    msg_03.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
               msg_03);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_78,local_58,
               &local_131);
    if ((long)local_130.m_message.px - local_130._0_8_ != 0x20) break;
    local_58 = *(undefined1 (*) [8])local_130._0_8_;
    auStack_50 = *(undefined1 (*) [16])(local_130._0_8_ + 8);
    paStack_40 = *(assertion_result **)(local_130._0_8_ + 0x18);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013c4738;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013c4730;
    auStack_50._0_8_ = uRam00000000013c4728;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,(check_type)_cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    auVar12 = *(undefined1 (*) [16])(pbVar6->pn + 4);
    local_d8.m_message.pn.pi_._0_1_ = auVar12[0];
    local_d8.m_message.pn.pi_._1_1_ = auVar12[1];
    local_d8.m_message.pn.pi_._2_1_ = auVar12[2];
    local_d8.m_message.pn.pi_._3_1_ = auVar12[3];
    local_d8.m_message.pn.pi_._4_1_ = auVar12[4];
    local_d8.m_message.pn.pi_._5_1_ = auVar12[5];
    local_d8.m_message.pn.pi_._6_1_ = auVar12[6];
    local_d8.m_message.pn.pi_._7_1_ = auVar12[7];
    cStack_c0 = auVar12[8];
    cStack_bf = auVar12[9];
    cStack_be = auVar12[10];
    cStack_bd = auVar12[0xb];
    cStack_bc = auVar12[0xc];
    cStack_bb = auVar12[0xd];
    cStack_ba = auVar12[0xe];
    cStack_b9 = auVar12[0xf];
    auVar16[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar16[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar16[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar16[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar16[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar16[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar16[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar16[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar16[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar16[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar16[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar16[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar16[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar16[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar16[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar16[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar36[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_d8.m_message.pn.pi_);
    auVar36[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_d8.m_message.pn.pi_._1_1_);
    auVar36[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_d8.m_message.pn.pi_._2_1_);
    auVar36[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_d8.m_message.pn.pi_._3_1_);
    auVar36[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_d8.m_message.pn.pi_._4_1_);
    auVar36[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_d8.m_message.pn.pi_._5_1_);
    auVar36[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_d8.m_message.pn.pi_._6_1_);
    auVar36[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_d8.m_message.pn.pi_._7_1_);
    auVar36[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_c0);
    auVar36[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_bf);
    auVar36[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_be);
    auVar36[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_bd);
    auVar36[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_bc);
    auVar36[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_bb);
    auVar36[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_ba);
    auVar36[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_b9);
    auVar16 = auVar16 & auVar36;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i)";
    local_140 = "";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_148;
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_210 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar40,(size_t)&local_218,0xaf);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    if ((char *)local_130._0_8_ != (char *)0x0) {
      operator_delete((void *)local_130._0_8_,(long)local_130.m_message.pn.pi_ - local_130._0_8_);
    }
    local_98._8_8_ = uRam00000000013c4728;
    local_98._0_8_ = R1L;
    local_88._8_8_ = uRam00000000013c4738;
    local_88._0_8_ = _DAT_013c4730;
    cVar40 = (check_type)_cVar40;
    _cVar42 = _cVar40;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,cVar40);
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xb1;
    file_04.m_begin = (iterator)&local_228;
    msg_04.m_end = pvVar10;
    msg_04.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
               msg_04);
    paStack_40 = (assertion_result *)uRam00000000013c4738;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013c4730;
    auStack_50._0_8_ = uRam00000000013c4728;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar29[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar29[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar29[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar29[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar29[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar29[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar29[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar29[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar29[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar29[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar29[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar29[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar29[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar29[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar29[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar29[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar17[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar17[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar17[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar17[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar17[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar17[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar17[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar17[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar17[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar17[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar17[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar17[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar17[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar17[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar17[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar17[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar17 = auVar17 & auVar29;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = '\0';
    local_d8.m_message.px._1_1_ = '\0';
    local_d8.m_message.px._2_1_ = '\0';
    local_d8.m_message.px._3_1_ = '\0';
    local_d8.m_message.px._4_1_ = '\0';
    local_d8.m_message.px._5_1_ = '\0';
    local_d8.m_message.px._6_1_ = '\0';
    local_d8.m_message.px._7_1_ = '\0';
    local_d8.m_message.pn.pi_._0_1_ = '\0';
    local_d8.m_message.pn.pi_._1_1_ = '\0';
    local_d8.m_message.pn.pi_._2_1_ = '\0';
    local_d8.m_message.pn.pi_._3_1_ = '\0';
    local_d8.m_message.pn.pi_._4_1_ = '\0';
    local_d8.m_message.pn.pi_._5_1_ = '\0';
    local_d8.m_message.pn.pi_._6_1_ = '\0';
    local_d8.m_message.pn.pi_._7_1_ = '\0';
    local_f8._0_8_ = "TmpL == (R1L << i)";
    local_f8.m_message.px = (element_type *)0xe606aa;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_240 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    paStack_40 = &local_f8;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar42,(size_t)&local_248,0xb1);
    uVar11 = (ulong)_cVar40 >> 3;
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    bVar5 = (byte)_cVar40 & 7;
    lVar7 = 0;
    do {
      if (uVar11 + lVar7 < 0x20) {
        bVar1 = R1Array[lVar7 + uVar11];
        local_78[lVar7] = bVar1 >> bVar5;
        if (uVar11 + lVar7 != 0x1f) {
          local_78[lVar7] =
               *(char *)(uVar11 + 0xe625a1 + lVar7) << (8 - bVar5 & 0x1f) | bVar1 >> bVar5;
        }
      }
      else {
        local_78[lVar7] = 0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xb4;
    file_05.m_begin = (iterator)&local_258;
    msg_05.m_end = pvVar10;
    msg_05.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
               msg_05);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_78,local_58,
               &local_131);
    if ((long)local_130.m_message.px - local_130._0_8_ != 0x20) break;
    local_58 = *(undefined1 (*) [8])local_130._0_8_;
    auStack_50 = *(undefined1 (*) [16])(local_130._0_8_ + 8);
    paStack_40 = *(assertion_result **)(local_130._0_8_ + 0x18);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013c4738;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013c4730;
    auStack_50._0_8_ = uRam00000000013c4728;
    pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    auVar12 = *(undefined1 (*) [16])(pbVar6->pn + 4);
    local_d8.m_message.pn.pi_._0_1_ = auVar12[0];
    local_d8.m_message.pn.pi_._1_1_ = auVar12[1];
    local_d8.m_message.pn.pi_._2_1_ = auVar12[2];
    local_d8.m_message.pn.pi_._3_1_ = auVar12[3];
    local_d8.m_message.pn.pi_._4_1_ = auVar12[4];
    local_d8.m_message.pn.pi_._5_1_ = auVar12[5];
    local_d8.m_message.pn.pi_._6_1_ = auVar12[6];
    local_d8.m_message.pn.pi_._7_1_ = auVar12[7];
    cStack_c0 = auVar12[8];
    cStack_bf = auVar12[9];
    cStack_be = auVar12[10];
    cStack_bd = auVar12[0xb];
    cStack_bc = auVar12[0xc];
    cStack_bb = auVar12[0xd];
    cStack_ba = auVar12[0xe];
    cStack_b9 = auVar12[0xf];
    auVar18[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar18[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar18[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar18[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar18[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar18[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar18[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar18[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar18[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar18[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar18[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar18[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar18[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar18[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar18[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar18[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar37[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_d8.m_message.pn.pi_);
    auVar37[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_d8.m_message.pn.pi_._1_1_);
    auVar37[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_d8.m_message.pn.pi_._2_1_);
    auVar37[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_d8.m_message.pn.pi_._3_1_);
    auVar37[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_d8.m_message.pn.pi_._4_1_);
    auVar37[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_d8.m_message.pn.pi_._5_1_);
    auVar37[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_d8.m_message.pn.pi_._6_1_);
    auVar37[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_d8.m_message.pn.pi_._7_1_);
    auVar37[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_c0);
    auVar37[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_bf);
    auVar37[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_be);
    auVar37[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_bd);
    auVar37[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_bc);
    auVar37[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_bb);
    auVar37[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_ba);
    auVar37[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_b9);
    auVar18 = auVar18 & auVar37;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i)";
    local_140 = "";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_148;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_270 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar42,(size_t)&local_278,0xb4);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    if ((char *)local_130._0_8_ != (char *)0x0) {
      operator_delete((void *)local_130._0_8_,(long)local_130.m_message.pn.pi_ - local_130._0_8_);
    }
    local_98._8_8_ = uRam00000000013c4728;
    local_98._0_8_ = R1L;
    local_88._8_8_ = uRam00000000013c4738;
    local_88._0_8_ = _DAT_013c4730;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,cVar40);
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xb6;
    file_06.m_begin = (iterator)&local_288;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
               msg_06);
    paStack_40 = (assertion_result *)uRam00000000013c4738;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013c4730;
    auStack_50._0_8_ = uRam00000000013c4728;
    pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar30[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar30[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar30[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar30[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar30[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar30[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar30[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar30[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar30[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar30[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar30[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar30[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar30[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar30[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar30[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar30[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar19[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar19[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar19[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar19[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar19[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar19[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar19[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar19[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar19[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar19[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar19[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar19[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar19[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar19[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar19[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar19[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar19 = auVar19 & auVar30;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = '\0';
    local_d8.m_message.px._1_1_ = '\0';
    local_d8.m_message.px._2_1_ = '\0';
    local_d8.m_message.px._3_1_ = '\0';
    local_d8.m_message.px._4_1_ = '\0';
    local_d8.m_message.px._5_1_ = '\0';
    local_d8.m_message.px._6_1_ = '\0';
    local_d8.m_message.px._7_1_ = '\0';
    local_d8.m_message.pn.pi_._0_1_ = '\0';
    local_d8.m_message.pn.pi_._1_1_ = '\0';
    local_d8.m_message.pn.pi_._2_1_ = '\0';
    local_d8.m_message.pn.pi_._3_1_ = '\0';
    local_d8.m_message.pn.pi_._4_1_ = '\0';
    local_d8.m_message.pn.pi_._5_1_ = '\0';
    local_d8.m_message.pn.pi_._6_1_ = '\0';
    local_d8.m_message.pn.pi_._7_1_ = '\0';
    local_f8._0_8_ = "TmpL == (R1L >> i)";
    local_f8.m_message.px = (element_type *)0xe6070c;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_f8;
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2a0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    uVar8 = 0xb6;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar42,(size_t)&local_2a8,0xb6);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    shiftArrayLeft(local_78,MaxArray,cVar40,uVar8);
    local_2b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2b0 = "";
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xb9;
    file_07.m_begin = (iterator)&local_2b8;
    msg_07.m_end = pvVar10;
    msg_07.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8,
               msg_07);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_78,local_58,
               &local_131);
    if ((long)local_130.m_message.px - local_130._0_8_ != 0x20) break;
    local_58 = *(undefined1 (*) [8])local_130._0_8_;
    auStack_50 = *(undefined1 (*) [16])(local_130._0_8_ + 8);
    paStack_40 = *(assertion_result **)(local_130._0_8_ + 0x18);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013c47b8;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013c47b0;
    auStack_50._0_8_ = uRam00000000013c47a8;
    cVar40 = (check_type)_cVar42;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    auVar12 = *(undefined1 (*) [16])(pbVar6->pn + 4);
    local_d8.m_message.pn.pi_._0_1_ = auVar12[0];
    local_d8.m_message.pn.pi_._1_1_ = auVar12[1];
    local_d8.m_message.pn.pi_._2_1_ = auVar12[2];
    local_d8.m_message.pn.pi_._3_1_ = auVar12[3];
    local_d8.m_message.pn.pi_._4_1_ = auVar12[4];
    local_d8.m_message.pn.pi_._5_1_ = auVar12[5];
    local_d8.m_message.pn.pi_._6_1_ = auVar12[6];
    local_d8.m_message.pn.pi_._7_1_ = auVar12[7];
    cStack_c0 = auVar12[8];
    cStack_bf = auVar12[9];
    cStack_be = auVar12[10];
    cStack_bd = auVar12[0xb];
    cStack_bc = auVar12[0xc];
    cStack_bb = auVar12[0xd];
    cStack_ba = auVar12[0xe];
    cStack_b9 = auVar12[0xf];
    auVar20[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar20[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar20[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar20[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar20[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar20[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar20[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar20[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar20[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar20[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar20[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar20[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar20[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar20[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar20[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar20[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar38[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_d8.m_message.pn.pi_);
    auVar38[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_d8.m_message.pn.pi_._1_1_);
    auVar38[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_d8.m_message.pn.pi_._2_1_);
    auVar38[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_d8.m_message.pn.pi_._3_1_);
    auVar38[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_d8.m_message.pn.pi_._4_1_);
    auVar38[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_d8.m_message.pn.pi_._5_1_);
    auVar38[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_d8.m_message.pn.pi_._6_1_);
    auVar38[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_d8.m_message.pn.pi_._7_1_);
    auVar38[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_c0);
    auVar38[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_bf);
    auVar38[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_be);
    auVar38[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_bd);
    auVar38[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_bc);
    auVar38[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_bb);
    auVar38[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_ba);
    auVar38[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_b9);
    auVar20 = auVar20 & auVar38;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i)";
    local_140 = "";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_148;
    local_2d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2d0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar42,(size_t)&local_2d8,0xb9);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    if ((char *)local_130._0_8_ != (char *)0x0) {
      operator_delete((void *)local_130._0_8_,(long)local_130.m_message.pn.pi_ - local_130._0_8_);
    }
    local_98._8_8_ = uRam00000000013c47a8;
    local_98._0_8_ = _MaxL;
    local_88._8_8_ = uRam00000000013c47b8;
    local_88._0_8_ = _DAT_013c47b0;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,cVar40);
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0xbb;
    file_08.m_begin = (iterator)&local_2e8;
    msg_08.m_end = pvVar10;
    msg_08.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8,
               msg_08);
    paStack_40 = (assertion_result *)uRam00000000013c47b8;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013c47b0;
    auStack_50._0_8_ = uRam00000000013c47a8;
    pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar31[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar31[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar31[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar31[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar31[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar31[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar31[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar31[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar31[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar31[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar31[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar31[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar31[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar31[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar31[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar31[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar21[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar21[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar21[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar21[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar21[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar21[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar21[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar21[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar21[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar21[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar21[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar21[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar21[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar21[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar21[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar21[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar21 = auVar21 & auVar31;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = '\0';
    local_d8.m_message.px._1_1_ = '\0';
    local_d8.m_message.px._2_1_ = '\0';
    local_d8.m_message.px._3_1_ = '\0';
    local_d8.m_message.px._4_1_ = '\0';
    local_d8.m_message.px._5_1_ = '\0';
    local_d8.m_message.px._6_1_ = '\0';
    local_d8.m_message.px._7_1_ = '\0';
    local_d8.m_message.pn.pi_._0_1_ = '\0';
    local_d8.m_message.pn.pi_._1_1_ = '\0';
    local_d8.m_message.pn.pi_._2_1_ = '\0';
    local_d8.m_message.pn.pi_._3_1_ = '\0';
    local_d8.m_message.pn.pi_._4_1_ = '\0';
    local_d8.m_message.pn.pi_._5_1_ = '\0';
    local_d8.m_message.pn.pi_._6_1_ = '\0';
    local_d8.m_message.pn.pi_._7_1_ = '\0';
    local_f8._0_8_ = "TmpL == (MaxL << i)";
    local_f8.m_message.px = (element_type *)0xe60770;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_f8;
    local_308 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_300 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar42,(size_t)&local_308,0xbb);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    lVar7 = 0;
    do {
      if (uVar11 + lVar7 < 0x20) {
        bVar1 = MaxArray[lVar7 + uVar11];
        local_78[lVar7] = bVar1 >> bVar5;
        if (uVar11 + lVar7 != 0x1f) {
          local_78[lVar7] =
               *(char *)(uVar11 + 0xe62661 + lVar7) << (8 - bVar5 & 0x1f) | bVar1 >> bVar5;
        }
      }
      else {
        local_78[lVar7] = 0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_310 = "";
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xbe;
    file_09.m_begin = (iterator)&local_318;
    msg_09.m_end = "";
    msg_09.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    _cVar41 = _cVar42;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328,
               msg_09);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_78,local_58,
               &local_131);
    if ((long)local_130.m_message.px - local_130._0_8_ != 0x20) break;
    local_58 = *(undefined1 (*) [8])local_130._0_8_;
    auStack_50 = *(undefined1 (*) [16])(local_130._0_8_ + 8);
    paStack_40 = *(assertion_result **)(local_130._0_8_ + 0x18);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013c47b8;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013c47b0;
    auStack_50._0_8_ = uRam00000000013c47a8;
    cVar40 = (check_type)_cVar42;
    pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,cVar40);
    local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
    local_d8.m_message.px._0_1_ = (char)pbVar6->pn[2];
    local_d8.m_message.px._1_1_ = *(char *)((long)pbVar6->pn + 9);
    local_d8.m_message.px._2_1_ = *(char *)((long)pbVar6->pn + 10);
    local_d8.m_message.px._3_1_ = *(char *)((long)pbVar6->pn + 0xb);
    local_d8.m_message.px._4_1_ = (char)pbVar6->pn[3];
    local_d8.m_message.px._5_1_ = *(char *)((long)pbVar6->pn + 0xd);
    local_d8.m_message.px._6_1_ = *(char *)((long)pbVar6->pn + 0xe);
    local_d8.m_message.px._7_1_ = *(char *)((long)pbVar6->pn + 0xf);
    auVar12 = *(undefined1 (*) [16])(pbVar6->pn + 4);
    local_d8.m_message.pn.pi_._0_1_ = auVar12[0];
    local_d8.m_message.pn.pi_._1_1_ = auVar12[1];
    local_d8.m_message.pn.pi_._2_1_ = auVar12[2];
    local_d8.m_message.pn.pi_._3_1_ = auVar12[3];
    local_d8.m_message.pn.pi_._4_1_ = auVar12[4];
    local_d8.m_message.pn.pi_._5_1_ = auVar12[5];
    local_d8.m_message.pn.pi_._6_1_ = auVar12[6];
    local_d8.m_message.pn.pi_._7_1_ = auVar12[7];
    cStack_c0 = auVar12[8];
    cStack_bf = auVar12[9];
    cStack_be = auVar12[10];
    cStack_bd = auVar12[0xb];
    cStack_bc = auVar12[0xc];
    cStack_bb = auVar12[0xd];
    cStack_ba = auVar12[0xe];
    cStack_b9 = auVar12[0xf];
    auVar22[0] = -((char)pbVar6->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar22[1] = -(*(char *)((long)pbVar6->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar22[2] = -(*(char *)((long)pbVar6->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar22[3] = -(*(char *)((long)pbVar6->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar22[4] = -((char)pbVar6->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar22[5] = -(*(char *)((long)pbVar6->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar22[6] = -(*(char *)((long)pbVar6->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar22[7] = -(*(char *)((long)pbVar6->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar22[8] = -((char)local_d8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar22[9] = -(local_d8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar22[10] = -(local_d8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar22[0xb] = -(local_d8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar22[0xc] = -(local_d8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar22[0xd] = -(local_d8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar22[0xe] = -(local_d8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar22[0xf] = -(local_d8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar39[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_d8.m_message.pn.pi_);
    auVar39[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_d8.m_message.pn.pi_._1_1_);
    auVar39[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_d8.m_message.pn.pi_._2_1_);
    auVar39[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_d8.m_message.pn.pi_._3_1_);
    auVar39[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_d8.m_message.pn.pi_._4_1_);
    auVar39[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_d8.m_message.pn.pi_._5_1_);
    auVar39[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_d8.m_message.pn.pi_._6_1_);
    auVar39[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_d8.m_message.pn.pi_._7_1_);
    auVar39[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_c0);
    auVar39[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_bf);
    auVar39[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_be);
    auVar39[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_bd);
    auVar39[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_bc);
    auVar39[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_bb);
    auVar39[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_ba);
    auVar39[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_b9);
    auVar22 = auVar22 & auVar39;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px = (element_type *)0x0;
    local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i)";
    local_140 = "";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_148;
    local_338 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_330 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_338,0xbe);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    if ((char *)local_130._0_8_ != (char *)0x0) {
      operator_delete((void *)local_130._0_8_,(long)local_130.m_message.pn.pi_ - local_130._0_8_);
    }
    local_98._8_8_ = uRam00000000013c47a8;
    local_98._0_8_ = _MaxL;
    local_88._8_8_ = uRam00000000013c47b8;
    local_88._0_8_ = _DAT_013c47b0;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,cVar40);
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = &DAT_000000c0;
    file_10.m_begin = (iterator)&local_348;
    msg_10.m_end = pvVar10;
    msg_10.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358,
               msg_10);
    paStack_40 = (assertion_result *)uRam00000000013c47b8;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013c47b0;
    auStack_50._0_8_ = uRam00000000013c47a8;
    pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,cVar40);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
    auVar32[0] = -((char)pbVar6->pn[4] == local_88[0]);
    auVar32[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_88[1]);
    auVar32[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_88[2]);
    auVar32[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_88[3]);
    auVar32[4] = -((char)pbVar6->pn[5] == local_88[4]);
    auVar32[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_88[5]);
    auVar32[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_88[6]);
    auVar32[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_88[7]);
    auVar32[8] = -((char)pbVar6->pn[6] == local_88[8]);
    auVar32[9] = -(*(char *)((long)pbVar6->pn + 0x19) == local_88[9]);
    auVar32[10] = -(*(char *)((long)pbVar6->pn + 0x1a) == local_88[10]);
    auVar32[0xb] = -(*(char *)((long)pbVar6->pn + 0x1b) == local_88[0xb]);
    auVar32[0xc] = -((char)pbVar6->pn[7] == local_88[0xc]);
    auVar32[0xd] = -(*(char *)((long)pbVar6->pn + 0x1d) == local_88[0xd]);
    auVar32[0xe] = -(*(char *)((long)pbVar6->pn + 0x1e) == local_88[0xe]);
    auVar32[0xf] = -(*(char *)((long)pbVar6->pn + 0x1f) == local_88[0xf]);
    auVar23[0] = -((char)pbVar6->pn[0] == local_98[0]);
    auVar23[1] = -(*(char *)((long)pbVar6->pn + 1) == local_98[1]);
    auVar23[2] = -(*(char *)((long)pbVar6->pn + 2) == local_98[2]);
    auVar23[3] = -(*(char *)((long)pbVar6->pn + 3) == local_98[3]);
    auVar23[4] = -((char)pbVar6->pn[1] == local_98[4]);
    auVar23[5] = -(*(char *)((long)pbVar6->pn + 5) == local_98[5]);
    auVar23[6] = -(*(char *)((long)pbVar6->pn + 6) == local_98[6]);
    auVar23[7] = -(*(char *)((long)pbVar6->pn + 7) == local_98[7]);
    auVar23[8] = -((char)pbVar6->pn[2] == local_98[8]);
    auVar23[9] = -(*(char *)((long)pbVar6->pn + 9) == local_98[9]);
    auVar23[10] = -(*(char *)((long)pbVar6->pn + 10) == local_98[10]);
    auVar23[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_98[0xb]);
    auVar23[0xc] = -((char)pbVar6->pn[3] == local_98[0xc]);
    auVar23[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_98[0xd]);
    auVar23[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_98[0xe]);
    auVar23[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_98[0xf]);
    auVar23 = auVar23 & auVar32;
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
    local_d8.m_message.px._0_1_ = '\0';
    local_d8.m_message.px._1_1_ = '\0';
    local_d8.m_message.px._2_1_ = '\0';
    local_d8.m_message.px._3_1_ = '\0';
    local_d8.m_message.px._4_1_ = '\0';
    local_d8.m_message.px._5_1_ = '\0';
    local_d8.m_message.px._6_1_ = '\0';
    local_d8.m_message.px._7_1_ = '\0';
    local_d8.m_message.pn.pi_._0_1_ = '\0';
    local_d8.m_message.pn.pi_._1_1_ = '\0';
    local_d8.m_message.pn.pi_._2_1_ = '\0';
    local_d8.m_message.pn.pi_._3_1_ = '\0';
    local_d8.m_message.pn.pi_._4_1_ = '\0';
    local_d8.m_message.pn.pi_._5_1_ = '\0';
    local_d8.m_message.pn.pi_._6_1_ = '\0';
    local_d8.m_message.pn.pi_._7_1_ = '\0';
    local_f8._0_8_ = "TmpL == (MaxL >> i)";
    local_f8.m_message.px = (element_type *)0xe613eb;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_368 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_360 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    in_RCX = 0xc0;
    paStack_40 = &local_f8;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_368,0xc0);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    _cVar40 = (check_type)((long)_cVar42 + 1);
    if ((check_type)_cVar40 == 0x100) {
      local_58 = (undefined1  [8])0x123456789abcdef;
      auStack_50 = (undefined1  [16])0x0;
      paStack_40 = (assertion_result *)0x0;
      uVar8 = 0x80;
      pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,0x80);
      local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar6->pn;
      local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar6->pn + 2);
      local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar6->pn + 4);
      local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar6->pn + 6);
      shift = 0;
      do {
        local_378 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_370 = "";
        local_388 = &boost::unit_test::basic_cstring<char_const>::null;
        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xc5;
        file_11.m_begin = (iterator)&local_378;
        msg_11.m_end = in_R9;
        msg_11.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388
                   ,msg_11);
        local_58 = (undefined1  [8])0x123456789abcdef;
        paStack_40 = (assertion_result *)0x0;
        auStack_50 = (undefined1  [16])0x0;
        pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,shift);
        local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
        uVar2 = *(undefined8 *)(pbVar6->pn + 2);
        uVar3 = *(undefined8 *)(pbVar6->pn + 4);
        uVar4 = *(undefined8 *)(pbVar6->pn + 6);
        local_d8.m_message.px._0_1_ = (char)uVar2;
        local_d8.m_message.px._1_1_ = (char)((ulong)uVar2 >> 8);
        local_d8.m_message.px._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_d8.m_message.px._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_d8.m_message.px._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_d8.m_message.px._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_d8.m_message.px._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_d8.m_message.px._7_1_ = (char)((ulong)uVar2 >> 0x38);
        local_d8.m_message.pn.pi_._0_1_ = (char)uVar3;
        local_d8.m_message.pn.pi_._1_1_ = (char)((ulong)uVar3 >> 8);
        local_d8.m_message.pn.pi_._2_1_ = (char)((ulong)uVar3 >> 0x10);
        local_d8.m_message.pn.pi_._3_1_ = (char)((ulong)uVar3 >> 0x18);
        local_d8.m_message.pn.pi_._4_1_ = (char)((ulong)uVar3 >> 0x20);
        local_d8.m_message.pn.pi_._5_1_ = (char)((ulong)uVar3 >> 0x28);
        local_d8.m_message.pn.pi_._6_1_ = (char)((ulong)uVar3 >> 0x30);
        local_d8.m_message.pn.pi_._7_1_ = (char)((ulong)uVar3 >> 0x38);
        cStack_c0 = (char)uVar4;
        cStack_bf = (char)((ulong)uVar4 >> 8);
        cStack_be = (char)((ulong)uVar4 >> 0x10);
        cStack_bd = (char)((ulong)uVar4 >> 0x18);
        cStack_bc = (char)((ulong)uVar4 >> 0x20);
        cStack_bb = (char)((ulong)uVar4 >> 0x28);
        cStack_ba = (char)((ulong)uVar4 >> 0x30);
        cStack_b9 = (char)((ulong)uVar4 >> 0x38);
        paStack_40 = (assertion_result *)local_b8.super_base_uint<256U>.pn._24_8_;
        local_58._0_4_ = local_b8.super_base_uint<256U>.pn[0];
        local_58._4_4_ = local_b8.super_base_uint<256U>.pn[1];
        auStack_50._8_4_ = local_b8.super_base_uint<256U>.pn[4];
        auStack_50._12_4_ = local_b8.super_base_uint<256U>.pn[5];
        auStack_50._0_4_ = local_b8.super_base_uint<256U>.pn[2];
        auStack_50._4_4_ = local_b8.super_base_uint<256U>.pn[3];
        pbVar6 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar8);
        local_f8._0_8_ = *(undefined8 *)pbVar6->pn;
        local_f8.m_message = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar6->pn + 2);
        cStack_e0 = (char)pbVar6->pn[6];
        cStack_df = *(char *)((long)pbVar6->pn + 0x19);
        cStack_de = *(char *)((long)pbVar6->pn + 0x1a);
        cStack_dd = *(char *)((long)pbVar6->pn + 0x1b);
        cStack_dc = (char)pbVar6->pn[7];
        cStack_db = *(char *)((long)pbVar6->pn + 0x1d);
        cStack_da = *(char *)((long)pbVar6->pn + 0x1e);
        cStack_d9 = *(char *)((long)pbVar6->pn + 0x1f);
        auVar33[0] = -((char)pbVar6->pn[4] == (char)local_d8.m_message.pn.pi_);
        auVar33[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_d8.m_message.pn.pi_._1_1_);
        auVar33[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_d8.m_message.pn.pi_._2_1_);
        auVar33[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_d8.m_message.pn.pi_._3_1_);
        auVar33[4] = -((char)pbVar6->pn[5] == local_d8.m_message.pn.pi_._4_1_);
        auVar33[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_d8.m_message.pn.pi_._5_1_);
        auVar33[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_d8.m_message.pn.pi_._6_1_);
        auVar33[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_d8.m_message.pn.pi_._7_1_);
        auVar33[8] = -(cStack_e0 == cStack_c0);
        auVar33[9] = -(cStack_df == cStack_bf);
        auVar33[10] = -(cStack_de == cStack_be);
        auVar33[0xb] = -(cStack_dd == cStack_bd);
        auVar33[0xc] = -(cStack_dc == cStack_bc);
        auVar33[0xd] = -(cStack_db == cStack_bb);
        auVar33[0xe] = -(cStack_da == cStack_ba);
        auVar33[0xf] = -(cStack_d9 == cStack_b9);
        auVar24[0] = -((class_property<bool>)*(class_property<bool> *)pbVar6->pn ==
                      local_d8.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value);
        auVar24[1] = -(*(char *)((long)pbVar6->pn + 1) == local_d8._1_1_);
        auVar24[2] = -(*(char *)((long)pbVar6->pn + 2) == local_d8._2_1_);
        auVar24[3] = -(*(char *)((long)pbVar6->pn + 3) == local_d8._3_1_);
        auVar24[4] = -((char)pbVar6->pn[1] == local_d8._4_1_);
        auVar24[5] = -(*(char *)((long)pbVar6->pn + 5) == local_d8._5_1_);
        auVar24[6] = -(*(char *)((long)pbVar6->pn + 6) == local_d8._6_1_);
        auVar24[7] = -(*(char *)((long)pbVar6->pn + 7) == local_d8._7_1_);
        auVar24[8] = -(*(char *)&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                                 (pbVar6->pn + 2))->px == (char)local_d8.m_message.px);
        auVar24[9] = -(*(char *)((long)pbVar6->pn + 9) == local_d8.m_message.px._1_1_);
        auVar24[10] = -(*(char *)((long)pbVar6->pn + 10) == local_d8.m_message.px._2_1_);
        auVar24[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_d8.m_message.px._3_1_);
        auVar24[0xc] = -((char)pbVar6->pn[3] == local_d8.m_message.px._4_1_);
        auVar24[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_d8.m_message.px._5_1_);
        auVar24[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_d8.m_message.px._6_1_);
        auVar24[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_d8.m_message.px._7_1_);
        auVar24 = auVar24 & auVar33;
        local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
        local_130.m_message.px = (element_type *)0x0;
        local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_148 = "(c1L << i) == (c2L >> (128-i))";
        local_140 = "";
        auStack_50._0_8_ = auStack_50._1_8_ << 8;
        local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
        paStack_40 = (assertion_result *)&local_148;
        local_398 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_390 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_398,0xc5);
        boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
        shift = shift + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      uVar8 = 0x80;
      do {
        local_3a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_3a0 = "";
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xc8;
        file_12.m_begin = (iterator)&local_3a8;
        msg_12.m_end = in_R9;
        msg_12.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8
                   ,msg_12);
        local_58 = (undefined1  [8])0x123456789abcdef;
        paStack_40 = (assertion_result *)0x0;
        auStack_50 = (undefined1  [16])0x0;
        pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar8);
        local_d8._0_8_ = *(undefined8 *)pbVar6->pn;
        uVar2 = *(undefined8 *)(pbVar6->pn + 2);
        uVar3 = *(undefined8 *)(pbVar6->pn + 4);
        uVar4 = *(undefined8 *)(pbVar6->pn + 6);
        local_d8.m_message.px._0_1_ = (char)uVar2;
        local_d8.m_message.px._1_1_ = (char)((ulong)uVar2 >> 8);
        local_d8.m_message.px._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_d8.m_message.px._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_d8.m_message.px._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_d8.m_message.px._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_d8.m_message.px._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_d8.m_message.px._7_1_ = (char)((ulong)uVar2 >> 0x38);
        local_d8.m_message.pn.pi_._0_1_ = (char)uVar3;
        local_d8.m_message.pn.pi_._1_1_ = (char)((ulong)uVar3 >> 8);
        local_d8.m_message.pn.pi_._2_1_ = (char)((ulong)uVar3 >> 0x10);
        local_d8.m_message.pn.pi_._3_1_ = (char)((ulong)uVar3 >> 0x18);
        local_d8.m_message.pn.pi_._4_1_ = (char)((ulong)uVar3 >> 0x20);
        local_d8.m_message.pn.pi_._5_1_ = (char)((ulong)uVar3 >> 0x28);
        local_d8.m_message.pn.pi_._6_1_ = (char)((ulong)uVar3 >> 0x30);
        local_d8.m_message.pn.pi_._7_1_ = (char)((ulong)uVar3 >> 0x38);
        cStack_c0 = (char)uVar4;
        cStack_bf = (char)((ulong)uVar4 >> 8);
        cStack_be = (char)((ulong)uVar4 >> 0x10);
        cStack_bd = (char)((ulong)uVar4 >> 0x18);
        cStack_bc = (char)((ulong)uVar4 >> 0x20);
        cStack_bb = (char)((ulong)uVar4 >> 0x28);
        cStack_ba = (char)((ulong)uVar4 >> 0x30);
        cStack_b9 = (char)((ulong)uVar4 >> 0x38);
        paStack_40 = (assertion_result *)local_b8.super_base_uint<256U>.pn._24_8_;
        local_58._0_4_ = local_b8.super_base_uint<256U>.pn[0];
        local_58._4_4_ = local_b8.super_base_uint<256U>.pn[1];
        auStack_50._8_4_ = local_b8.super_base_uint<256U>.pn[4];
        auStack_50._12_4_ = local_b8.super_base_uint<256U>.pn[5];
        auStack_50._0_4_ = local_b8.super_base_uint<256U>.pn[2];
        auStack_50._4_4_ = local_b8.super_base_uint<256U>.pn[3];
        pbVar6 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar8 - 0x80);
        local_f8._0_8_ = *(undefined8 *)pbVar6->pn;
        local_f8.m_message = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar6->pn + 2);
        cStack_e0 = (char)pbVar6->pn[6];
        cStack_df = *(char *)((long)pbVar6->pn + 0x19);
        cStack_de = *(char *)((long)pbVar6->pn + 0x1a);
        cStack_dd = *(char *)((long)pbVar6->pn + 0x1b);
        cStack_dc = (char)pbVar6->pn[7];
        cStack_db = *(char *)((long)pbVar6->pn + 0x1d);
        cStack_da = *(char *)((long)pbVar6->pn + 0x1e);
        cStack_d9 = *(char *)((long)pbVar6->pn + 0x1f);
        auVar34[0] = -((char)pbVar6->pn[4] == (char)local_d8.m_message.pn.pi_);
        auVar34[1] = -(*(char *)((long)pbVar6->pn + 0x11) == local_d8.m_message.pn.pi_._1_1_);
        auVar34[2] = -(*(char *)((long)pbVar6->pn + 0x12) == local_d8.m_message.pn.pi_._2_1_);
        auVar34[3] = -(*(char *)((long)pbVar6->pn + 0x13) == local_d8.m_message.pn.pi_._3_1_);
        auVar34[4] = -((char)pbVar6->pn[5] == local_d8.m_message.pn.pi_._4_1_);
        auVar34[5] = -(*(char *)((long)pbVar6->pn + 0x15) == local_d8.m_message.pn.pi_._5_1_);
        auVar34[6] = -(*(char *)((long)pbVar6->pn + 0x16) == local_d8.m_message.pn.pi_._6_1_);
        auVar34[7] = -(*(char *)((long)pbVar6->pn + 0x17) == local_d8.m_message.pn.pi_._7_1_);
        auVar34[8] = -(cStack_e0 == cStack_c0);
        auVar34[9] = -(cStack_df == cStack_bf);
        auVar34[10] = -(cStack_de == cStack_be);
        auVar34[0xb] = -(cStack_dd == cStack_bd);
        auVar34[0xc] = -(cStack_dc == cStack_bc);
        auVar34[0xd] = -(cStack_db == cStack_bb);
        auVar34[0xe] = -(cStack_da == cStack_ba);
        auVar34[0xf] = -(cStack_d9 == cStack_b9);
        auVar25[0] = -((class_property<bool>)*(class_property<bool> *)pbVar6->pn ==
                      local_d8.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value);
        auVar25[1] = -(*(char *)((long)pbVar6->pn + 1) == local_d8._1_1_);
        auVar25[2] = -(*(char *)((long)pbVar6->pn + 2) == local_d8._2_1_);
        auVar25[3] = -(*(char *)((long)pbVar6->pn + 3) == local_d8._3_1_);
        auVar25[4] = -((char)pbVar6->pn[1] == local_d8._4_1_);
        auVar25[5] = -(*(char *)((long)pbVar6->pn + 5) == local_d8._5_1_);
        auVar25[6] = -(*(char *)((long)pbVar6->pn + 6) == local_d8._6_1_);
        auVar25[7] = -(*(char *)((long)pbVar6->pn + 7) == local_d8._7_1_);
        auVar25[8] = -(*(char *)&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                                 (pbVar6->pn + 2))->px == (char)local_d8.m_message.px);
        auVar25[9] = -(*(char *)((long)pbVar6->pn + 9) == local_d8.m_message.px._1_1_);
        auVar25[10] = -(*(char *)((long)pbVar6->pn + 10) == local_d8.m_message.px._2_1_);
        auVar25[0xb] = -(*(char *)((long)pbVar6->pn + 0xb) == local_d8.m_message.px._3_1_);
        auVar25[0xc] = -((char)pbVar6->pn[3] == local_d8.m_message.px._4_1_);
        auVar25[0xd] = -(*(char *)((long)pbVar6->pn + 0xd) == local_d8.m_message.px._5_1_);
        auVar25[0xe] = -(*(char *)((long)pbVar6->pn + 0xe) == local_d8.m_message.px._6_1_);
        auVar25[0xf] = -(*(char *)((long)pbVar6->pn + 0xf) == local_d8.m_message.px._7_1_);
        auVar25 = auVar25 & auVar34;
        local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
        local_130.m_message.px = (element_type *)0x0;
        local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_148 = "(c1L << i) == (c2L << (i-128))";
        local_140 = "";
        auStack_50._0_8_ = auStack_50._1_8_ << 8;
        local_58 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
        paStack_40 = (assertion_result *)&local_148;
        local_3c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_3c0 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar41,(size_t)&local_3c8,200);
        boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x100);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("vch.size() == WIDTH",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
}

Assistant:

BOOST_AUTO_TEST_CASE( shifts ) { // "<<"  ">>"  "<<="  ">>="
    unsigned char TmpArray[32];
    arith_uint256 TmpL;
    for (unsigned int i = 0; i < 256; ++i)
    {
        shiftArrayLeft(TmpArray, OneArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i));
        TmpL = OneL; TmpL <<= i;
        BOOST_CHECK(TmpL == (OneL << i));
        BOOST_CHECK((HalfL >> (255-i)) == (OneL << i));
        TmpL = HalfL; TmpL >>= (255-i);
        BOOST_CHECK(TmpL == (OneL << i));

        shiftArrayLeft(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i));
        TmpL = R1L; TmpL <<= i;
        BOOST_CHECK(TmpL == (R1L << i));

        shiftArrayRight(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i));
        TmpL = R1L; TmpL >>= i;
        BOOST_CHECK(TmpL == (R1L >> i));

        shiftArrayLeft(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i));
        TmpL = MaxL; TmpL <<= i;
        BOOST_CHECK(TmpL == (MaxL << i));

        shiftArrayRight(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i));
        TmpL = MaxL; TmpL >>= i;
        BOOST_CHECK(TmpL == (MaxL >> i));
    }
    arith_uint256 c1L = arith_uint256(0x0123456789abcdefULL);
    arith_uint256 c2L = c1L << 128;
    for (unsigned int i = 0; i < 128; ++i) {
        BOOST_CHECK((c1L << i) == (c2L >> (128-i)));
    }
    for (unsigned int i = 128; i < 256; ++i) {
        BOOST_CHECK((c1L << i) == (c2L << (i-128)));
    }
}